

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkHaigCreateClasses(Vec_Ptr_t *vMembers)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  void *pvVar4;
  undefined8 *puVar5;
  long lVar6;
  long *plVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  void **ppvVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 0x1002;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(0x8010);
  pVVar8->pArray = ppvVar9;
  if (0 < vMembers->nSize) {
    lVar13 = 0;
    do {
      plVar3 = *vMembers->pArray[lVar13];
      if (*plVar3 != 0) {
        __assert_fail("pRepr->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                      ,0x54,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
      }
      if ((*(uint *)(plVar3 + 4) & 0x10) == 0) {
        *(uint *)(plVar3 + 4) = *(uint *)(plVar3 + 4) | 0x10;
        uVar1 = pVVar8->nSize;
        uVar2 = pVVar8->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
            }
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar2 * 2;
            if (iVar12 <= (int)uVar2) goto LAB_00884178;
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar8->pArray = ppvVar9;
          pVVar8->nCap = iVar12;
        }
LAB_00884178:
        pVVar8->nSize = uVar1 + 1;
        pVVar8->pArray[(int)uVar1] = plVar3;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < vMembers->nSize);
  }
  iVar12 = pVVar8->nSize;
  lVar13 = (long)iVar12;
  if (0 < lVar13) {
    ppvVar9 = pVVar8->pArray;
    lVar11 = 0;
    do {
      pvVar4 = ppvVar9[lVar11];
      *(uint *)((long)pvVar4 + 0x20) = *(uint *)((long)pvVar4 + 0x20) & 0xffffffef;
      *(void **)pvVar4 = pvVar4;
      lVar11 = lVar11 + 1;
    } while (lVar13 != lVar11);
  }
  if (0 < vMembers->nSize) {
    lVar11 = 0;
    do {
      puVar5 = (undefined8 *)vMembers->pArray[lVar11];
      if (*(int *)((long)puVar5 + 0x24) < *(int *)(*(long *)*puVar5 + 0x24)) {
        *(long *)*puVar5 = (long)puVar5;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vMembers->nSize);
  }
  if (0 < vMembers->nSize) {
    lVar11 = 0;
    do {
      plVar3 = (long *)vMembers->pArray[lVar11];
      lVar6 = *(long *)*plVar3;
      *plVar3 = lVar6;
      if (*(int *)((long)plVar3 + 0x24) < *(int *)(lVar6 + 0x24)) {
        __assert_fail("((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                      ,0x70,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vMembers->nSize);
  }
  if (0 < iVar12) {
    ppvVar9 = pVVar8->pArray;
    lVar11 = 0;
    do {
      plVar3 = (long *)ppvVar9[lVar11];
      plVar7 = (long *)*plVar3;
      if ((long *)*plVar7 != plVar7) {
        __assert_fail("pRepr->pData == pRepr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                      ,0x77,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
      }
      ppvVar9[lVar11] = plVar7;
      uVar1 = vMembers->nCap;
      if (vMembers->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vMembers->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(vMembers->pArray,0x80);
          }
          vMembers->pArray = ppvVar10;
          iVar12 = 0x10;
        }
        else {
          iVar12 = uVar1 * 2;
          if (iVar12 <= (int)uVar1) goto LAB_008842bc;
          if (vMembers->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(vMembers->pArray,(ulong)uVar1 << 4);
          }
          vMembers->pArray = ppvVar10;
        }
        vMembers->nCap = iVar12;
      }
LAB_008842bc:
      iVar12 = vMembers->nSize;
      vMembers->nSize = iVar12 + 1;
      vMembers->pArray[iVar12] = plVar3;
      lVar11 = lVar11 + 1;
    } while (lVar13 != lVar11);
  }
  if (0 < vMembers->nSize) {
    lVar13 = 0;
    do {
      puVar5 = (undefined8 *)vMembers->pArray[lVar13];
      if ((undefined8 *)*puVar5 == puVar5) {
        *puVar5 = 0;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < vMembers->nSize);
  }
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Abc_NtkHaigCreateClasses( Vec_Ptr_t * vMembers )
{
    Vec_Ptr_t * vClasses;
    Hop_Obj_t * pObj, * pRepr;
    int i;

    // count classes
    vClasses = Vec_PtrAlloc( 4098 );
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        assert( pRepr->pData == NULL );
        if ( pRepr->fMarkA == 0 ) // new
        {
            pRepr->fMarkA = 1;
            Vec_PtrPush( vClasses, pRepr );
        }
    }

    // set representatives as representatives
    Vec_PtrForEachEntry( Hop_Obj_t *, vClasses, pObj, i )
    {
        pObj->fMarkA = 0;
        pObj->pData = pObj;
    }

    // go through the members and update
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        if ( ((Hop_Obj_t *)pRepr->pData)->Id > pObj->Id )
            pRepr->pData = pObj;
    }

    // change representatives of the class
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        pObj->pData = pRepr->pData;
        assert( ((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id );
    }

    // update classes
    Vec_PtrForEachEntry( Hop_Obj_t *, vClasses, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        assert( pRepr->pData == pRepr );
//        pRepr->pData = NULL;
        Vec_PtrWriteEntry( vClasses, i, pRepr );
        Vec_PtrPush( vMembers, pObj );
    }

    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
        if ( pObj->pData == pObj )
            pObj->pData = NULL;

/*
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        printf( "ObjId = %4d : ", pObj->Id );
        if ( pObj->pData == NULL )
        {
            printf( "NULL" );
        }
        else
        {
            printf( "%4d", ((Hop_Obj_t *)pObj->pData)->Id );
            assert( ((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id );
        }
        printf( "\n" );
    }
*/
    return vClasses;
}